

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_range_exception(sexp ctx,sexp obj,sexp start,sexp end)

{
  sexp b;
  sexp psVar1;
  sexp in_RDI;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp msg;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp in_stack_ffffffffffffffa8;
  undefined8 source;
  sexp irritants;
  char *str;
  undefined8 ctx_00;
  undefined8 ctx_01;
  undefined8 local_28;
  undefined8 local_8;
  
  local_28 = 0x43e;
  local_8 = in_RDI;
  memset(&stack0xffffffffffffffc8,0,0x10);
  str = &DAT_0000043e;
  memset(&stack0xffffffffffffffb0,0,0x10);
  ctx_00 = &stack0xffffffffffffffd8;
  ctx_01 = (((sexp)local_8)->value).context.saves;
  (((sexp)local_8)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffc8;
  psVar1 = (sexp)&stack0xffffffffffffffc0;
  irritants = *(sexp *)((long)&((sexp)local_8)->value + 0x6078);
  (((sexp)local_8)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffb0;
  b = sexp_c_string((sexp)ctx_00,str,(sexp_sint_t)irritants);
  local_28 = sexp_list2((sexp)ctx_01,(sexp)ctx_00,b);
  local_28 = sexp_cons_op((sexp)ctx_00,b,(sexp_sint_t)irritants,psVar1,in_stack_ffffffffffffffa8);
  source = local_8;
  sexp_intern((sexp)__sexp_gc_preserver1.next,(char *)__sexp_gc_preserver1.var,(sexp_sint_t)msg);
  psVar1 = sexp_make_exception((sexp)ctx_01,(sexp)ctx_00,b,irritants,psVar1,(sexp)source);
  (((sexp)local_8)->value).context.saves = (sexp_gc_var_t *)ctx_01;
  return psVar1;
}

Assistant:

sexp sexp_range_exception (sexp ctx, sexp obj, sexp start, sexp end) {
  sexp_gc_var2(res, msg);
  sexp_gc_preserve2(ctx, res, msg);
  msg = sexp_c_string(ctx, "bad index range", -1);
  res = sexp_list2(ctx, start, end);
  res = sexp_cons(ctx, obj, res);
  res = sexp_make_exception(ctx, sexp_intern(ctx, "range", -1), msg, res,
                            SEXP_FALSE, SEXP_FALSE);
  sexp_gc_release2(ctx);
  return res;
}